

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O1

int insert_between(ll_head *q_head,ll_elem *n,ll_elem *p,ll_elem *s)

{
  elem_ptr_t *peVar1;
  atomic_size_t *paVar2;
  long *plVar3;
  long lVar4;
  atomic_size_t aVar5;
  elem_ptr_t eVar6;
  ulong uVar7;
  elem_ptr_t eVar8;
  ulong uVar9;
  ulong uVar10;
  ll_elem *plVar11;
  ll_elem *plVar12;
  ll_elem *plVar13;
  ll_elem *plVar14;
  bool bVar15;
  
  if (((ulong)q_head & 3) != 0) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1c7,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  plVar13 = (ll_elem *)((ulong)n & 0xfffffffffffffffc);
  if (plVar13 != n) {
    __assert_fail("n == ptr_clear(n)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1c8,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  plVar11 = (ll_elem *)((ulong)p & 0xfffffffffffffffc);
  if (plVar11 != p) {
    __assert_fail("p == ptr_clear(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1c9,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  plVar12 = (ll_elem *)((ulong)s & 0xfffffffffffffffc);
  if (plVar12 != s) {
    __assert_fail("s == ptr_clear(s)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1ca,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  if (3 < n->pred) {
    __assert_fail("ptr_clear((struct ll_elem*)atomic_load_explicit(&n->pred, memory_order_relaxed)) == NULL"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1cd
                  ,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  if (n->succ != 2) {
    __assert_fail("atomic_load_explicit(&n->succ, memory_order_relaxed) == FLAGGED",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1ce,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  if (n->refcnt == 0) {
    __assert_fail("atomic_load_explicit(&n->refcnt, memory_order_relaxed) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1cf,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  peVar1 = &n->pred;
  do {
  } while (*peVar1 != 0);
  LOCK();
  plVar11->refcnt = plVar11->refcnt + 1;
  UNLOCK();
  LOCK();
  plVar12->refcnt = plVar12->refcnt + 1;
  UNLOCK();
  LOCK();
  uVar9 = n->succ;
  bVar15 = uVar9 == 2;
  if (bVar15) {
    n->succ = (ulong)s | 3;
    uVar9 = 2;
  }
  UNLOCK();
  if ((uVar9 & 0xfffffffffffffffe) == 2 && !bVar15) {
    do {
      LOCK();
      uVar9 = n->succ;
      bVar15 = uVar9 == 2;
      if (bVar15) {
        n->succ = (ulong)s | 3;
        uVar9 = 2;
      }
      UNLOCK();
    } while ((!bVar15) && ((uVar9 & 0xfffffffffffffffe) == 2));
  }
  if (!bVar15) {
    __assert_fail("cas","/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                  0x1e3,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  LOCK();
  uVar9 = n->succ;
  n->succ = n->succ & 0xfffffffffffffffe;
  UNLOCK();
  if ((uVar9 & 1) != 0) {
    LOCK();
    uVar9 = *peVar1;
    bVar15 = uVar9 == 0;
    if (bVar15) {
      *peVar1 = (ulong)plVar11 | 1;
      uVar9 = 0;
    }
    UNLOCK();
    if (uVar9 < 2 && !bVar15) {
      do {
        LOCK();
        uVar9 = *peVar1;
        bVar15 = uVar9 == 0;
        if (bVar15) {
          *peVar1 = (ulong)plVar11 | 1;
          uVar9 = 0;
        }
        UNLOCK();
      } while ((!bVar15) && (uVar9 < 2));
    }
    if (!bVar15) {
      __assert_fail("cas",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                    0x1e8,
                    "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                   );
    }
    LOCK();
    uVar9 = *peVar1;
    *peVar1 = *peVar1 & 0xfffffffffffffffe;
    UNLOCK();
    if ((uVar9 & 1) == 0) goto LAB_001026cf;
    uVar9 = (ulong)s | 2;
    eVar8 = p->succ;
    do {
      LOCK();
      eVar6 = p->succ;
      bVar15 = eVar8 == eVar6;
      if (bVar15) {
        p->succ = eVar8 | 1;
        eVar6 = eVar8;
      }
      UNLOCK();
      eVar8 = eVar6;
    } while (!bVar15);
    while ((eVar6 & 1) != 0) {
      eVar8 = p->succ;
      do {
        LOCK();
        eVar6 = p->succ;
        bVar15 = eVar8 == eVar6;
        if (bVar15) {
          p->succ = eVar8 | 1;
          eVar6 = eVar8;
        }
        UNLOCK();
        eVar8 = eVar6;
      } while (!bVar15);
    }
    plVar14 = (ll_elem *)(eVar6 & 0xfffffffffffffffc);
    if (plVar14 != (ll_elem *)0x0) {
      LOCK();
      plVar14->refcnt = plVar14->refcnt + 1;
      UNLOCK();
    }
    LOCK();
    uVar7 = p->succ;
    p->succ = p->succ & 0xfffffffffffffffe;
    UNLOCK();
    if ((uVar7 & 1) == 0) {
      __assert_fail("old & DEREF",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0xb0
                    ,"struct ll_elem *deref(elem_ptr_t *)");
    }
    if ((plVar14 == plVar12) && ((plVar11->pred & 2) == 0)) {
      if ((eVar6 & 1) != 0) goto LAB_0010270d;
      do {
        LOCK();
        uVar7 = p->succ;
        bVar15 = eVar6 == uVar7;
        if (bVar15) {
          p->succ = (long)&plVar13->succ + (ulong)((uint)eVar6 & 2) + 1;
          uVar7 = eVar6;
        }
        UNLOCK();
        uVar10 = eVar6;
      } while ((!bVar15) && (uVar10 = uVar7, (uVar7 & 0xfffffffffffffffe) == eVar6));
      if (bVar15) {
        if ((plVar11->pred & 2) == 0) {
          LOCK();
          plVar13->refcnt = plVar13->refcnt + 1;
          UNLOCK();
          LOCK();
          uVar9 = p->succ;
          p->succ = p->succ & 0xfffffffffffffffe;
          UNLOCK();
          if ((uVar9 & 1) == 0) goto LAB_001026cf;
          LOCK();
          paVar2 = &plVar14->refcnt;
          uVar9 = *paVar2;
          *paVar2 = *paVar2 - 2;
          UNLOCK();
          if (1 < uVar9) {
            plVar13 = pred(q_head,s);
            LOCK();
            plVar3 = (long *)(((ulong)plVar13 & 0xfffffffffffffffc) + 0x10);
            lVar4 = *plVar3;
            *plVar3 = *plVar3 + -1;
            UNLOCK();
            if (lVar4 != 0) {
              LOCK();
              q_head->size = q_head->size + 1;
              UNLOCK();
              LOCK();
              n->succ = n->succ & 0xfffffffffffffffd;
              UNLOCK();
              return 1;
            }
          }
          goto LAB_001026ee;
        }
        LOCK();
        uVar7 = p->succ;
        p->succ = uVar10;
        UNLOCK();
        if ((ll_elem *)(uVar7 & 0xfffffffffffffffc) != n) {
          __assert_fail("(tmp & ~(FLAGGED | DEREF)) == (uintptr_t)n",
                        "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                        0x209,
                        "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                       );
        }
        if ((uVar7 & 1) == 0) {
          __assert_fail("tmp & DEREF",
                        "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                        0x20a,
                        "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                       );
        }
      }
    }
    if (((ulong)s & 1) != 0) {
LAB_0010270d:
      __assert_fail("!((uintptr_t)old & DEREF)",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0xdb
                    ,"int ptr_cas(elem_ptr_t *, struct ll_elem **, struct ll_elem *)");
    }
    LOCK();
    uVar7 = n->succ;
    bVar15 = uVar9 == uVar7;
    if (bVar15) {
      n->succ = 3;
      uVar7 = uVar9;
    }
    UNLOCK();
    if ((uVar7 & 0xfffffffffffffffe) == uVar9 && !bVar15) {
      do {
        LOCK();
        uVar7 = n->succ;
        bVar15 = uVar9 == uVar7;
        if (bVar15) {
          n->succ = 3;
          uVar7 = uVar9;
        }
        UNLOCK();
      } while ((!bVar15) && ((uVar7 & 0xfffffffffffffffe) == uVar9));
    }
    if (!bVar15) {
      __assert_fail("cas",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                    0x223,
                    "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                   );
    }
    LOCK();
    uVar9 = n->succ;
    n->succ = n->succ & 0xfffffffffffffffe;
    UNLOCK();
    if ((uVar9 & 1) != 0) {
      if (((ulong)p & 1) != 0) goto LAB_0010270d;
      eVar8 = (ulong)((uint)p & 2) + 1;
      LOCK();
      plVar13 = (ll_elem *)*peVar1;
      bVar15 = p == plVar13;
      if (bVar15) {
        *peVar1 = eVar8;
        plVar13 = p;
      }
      UNLOCK();
      if ((ll_elem *)((ulong)plVar13 & 0xfffffffffffffffe) == p && !bVar15) {
        do {
          LOCK();
          plVar13 = (ll_elem *)*peVar1;
          bVar15 = p == plVar13;
          if (bVar15) {
            *peVar1 = eVar8;
            plVar13 = p;
          }
          UNLOCK();
        } while ((!bVar15) && ((ll_elem *)((ulong)plVar13 & 0xfffffffffffffffe) == p));
      }
      if (!bVar15) {
        __assert_fail("cas",
                      "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x229,
                      "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                     );
      }
      LOCK();
      uVar9 = *peVar1;
      *peVar1 = *peVar1 & 0xfffffffffffffffe;
      UNLOCK();
      if ((uVar9 & 1) != 0) {
        LOCK();
        paVar2 = &plVar11->refcnt;
        aVar5 = *paVar2;
        *paVar2 = *paVar2 - 1;
        UNLOCK();
        if (aVar5 != 0) {
          LOCK();
          paVar2 = &plVar12->refcnt;
          aVar5 = *paVar2;
          *paVar2 = *paVar2 - 1;
          UNLOCK();
          if (aVar5 != 0) {
            LOCK();
            paVar2 = &plVar14->refcnt;
            aVar5 = *paVar2;
            *paVar2 = *paVar2 - 1;
            UNLOCK();
            if (aVar5 != 0) {
              return 0;
            }
          }
        }
LAB_001026ee:
        __assert_fail("old >= count",
                      "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x9a,"void deref_release(struct ll_head *, struct ll_elem *, size_t)");
      }
    }
  }
LAB_001026cf:
  __assert_fail("p & DEREF",
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0xf5,
                "void ptr_clear_deref(elem_ptr_t *)");
}

Assistant:

static int
insert_between(struct ll_head *q_head, struct ll_elem *n,
    struct ll_elem *p, struct ll_elem *s)
{
	struct ll_elem	*q, *ps = NULL, *ps_, *old;
	int		 cas;

	q = &q_head->q;
	/* Check arguments. */
	assert(q == ptr_clear(q));
	assert(n == ptr_clear(n));
	assert(p == ptr_clear(p));
	assert(s == ptr_clear(s));
	/* Check initial state of n. */
	assert(ptr_clear((struct ll_elem*)atomic_load_explicit(&n->pred,
	    memory_order_relaxed)) == NULL);
	assert(atomic_load_explicit(&n->succ, memory_order_relaxed) == FLAGGED);
	assert(atomic_load_explicit(&n->refcnt, memory_order_relaxed) > 0);
	/*
	 * Give unlink_release() time to update n->pred.
	 * XXX try and make this an aid function?
	 */
	while (atomic_load_explicit(&n->pred, memory_order_relaxed) != 0)
		SPINWAIT();

	/*
	 * Assign n->pred, n->succ.
	 *
	 * We add a flag to s, to prevent deletion operations from starting
	 * before we are ready.
	 */
	deref_acquire(p, 1);	/* Because n->pred = p. */
	deref_acquire(s, 1);	/* Because n->succ = s. */

	old = (struct ll_elem*)FLAGGED;
	cas = ptr_cas(&n->succ, &old,
	    (struct ll_elem*)((uintptr_t)s | FLAGGED));
	assert(cas);
	ptr_clear_deref(&n->succ);

	old = NULL;
	cas = ptr_cas(&n->pred, &old, p);
	assert(cas);
	ptr_clear_deref(&n->pred);

	/* Load bits in p->succ. */
	ps = deref(&p->succ);
	if (ptr_clear(ps) != ptr_clear(s) || deleted(p))
		goto fail;

	/* Exchange p->succ from s to n. */
	ps_ = ps;
	if (!ptr_cas(&p->succ, &ps_, n))
		goto fail;
	/*
	 * If p is not deleted at this moment, the link is succesful
	 * (since a non-deleted p means p is reachable from q and
	 * our update changed n to be reachable from p,
	 * hence it's reachable from q).
	 *
	 * Note that we hold the DEREF on ps->succ, so it cannot change.
	 *
	 * Also, note that we do not care if s has the deleted bit set:
	 * if it is being deleted, its deletor would have to update
	 * p->succ as well; we simply won the race to do that.
	 */
	if (deleted(p)) {
		uintptr_t	 tmp;

		/*
		 * Restore old value, note that this operation also clears
		 * the deref bit, since ps_ will not have that set.
		 */
		tmp = atomic_exchange_explicit(&p->succ, (uintptr_t)ps_,
		    memory_order_release);
		assert((tmp & ~(FLAGGED | DEREF)) == (uintptr_t)n);
		assert(tmp & DEREF);
		goto fail;
	}

	/* Update succesful.  Update deref counter on n and release p->succ. */
	deref_acquire(n, 1);
	ptr_clear_deref(&p->succ);
	/* Forget ps. */
	deref_release(q_head, ps, 2);	/* Once for ps, once for p->succ. */
	ps = NULL;

	/* Fix pred pointer of s. */
	deref_release(q_head, pred(q_head, s), 1);

	/* Update list size. */
	atomic_fetch_add_explicit(&q_head->size, 1, memory_order_relaxed);
	/* Clear delete block. */
	atomic_fetch_and_explicit(&n->succ, ~FLAGGED, memory_order_release);

	return 1;

fail:
	/* Undo setting n->succ. */
	old = (struct ll_elem*)((uintptr_t)s | FLAGGED);
	cas = ptr_cas(&n->succ, &old, (struct ll_elem*)FLAGGED);
	assert(cas);
	ptr_clear_deref(&n->succ);

	/* Undo setting n->pred. */
	old = p;
	cas = ptr_cas(&n->pred, &old, NULL);
	assert(cas);
	ptr_clear_deref(&n->pred);

	deref_release(q_head, p, 1);
	deref_release(q_head, s, 1);
	deref_release(q_head, ps, 1);
	return 0;
}